

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::saveVectors(FastText *this)

{
  char cVar1;
  int32_t iVar2;
  ostream *poVar3;
  int id;
  int local_ad4;
  Vector subipa;
  Vector submorph;
  Vector sublemma;
  Vector subvec;
  Vector vec;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mapOfSubWords;
  string word;
  ofstream ofi;
  ofstream ofmorph;
  ofstream oflemma;
  ofstream ofsub;
  ofstream ofs;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Saving Vectors");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofsub,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->output,".vec");
  std::ofstream::ofstream(&ofs,(string *)&ofsub,_S_out);
  std::__cxx11::string::~string((string *)&ofsub);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oflemma,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->suboutput,".vec");
  std::ofstream::ofstream(&ofsub,(string *)&oflemma,_S_out);
  std::__cxx11::string::~string((string *)&oflemma);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofmorph,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->lemmaoutput,".vec");
  std::ofstream::ofstream(&oflemma,(string *)&ofmorph,_S_out);
  std::__cxx11::string::~string((string *)&ofmorph);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofi,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->morphoutput,".vec");
  std::ofstream::ofstream(&ofmorph,(string *)&ofi,_S_out);
  std::__cxx11::string::~string((string *)&ofi);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mapOfSubWords
                 ,&((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->ipaoutput,".vec");
  std::ofstream::ofstream(&ofi,(string *)&mapOfSubWords,_S_out);
  std::__cxx11::string::~string((string *)&mapOfSubWords);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Error opening file for saving vectors.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      iVar2 = Dictionary::nwords((this->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      poVar3 = (ostream *)std::ostream::operator<<(&ofs,iVar2);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,((this->args_).
                                  super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->dim);
      std::endl<char,std::char_traits<char>>(poVar3);
      Vector::Vector(&vec,(long)((this->args_).
                                 super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->dim);
      Vector::Vector(&subvec,(long)((this->args_).
                                    super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->dim);
      Vector::Vector(&sublemma,
                     (long)((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           dim);
      Vector::Vector(&submorph,
                     (long)((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           dim);
      Vector::Vector(&subipa,(long)((this->args_).
                                    super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->dim);
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header;
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      id = 0;
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        local_ad4 = id;
        iVar2 = Dictionary::nwords((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        if (iVar2 <= id) break;
        Dictionary::getWord_abi_cxx11_
                  (&word,(this->dict_).
                         super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,id);
        getVector(this,&vec,&word);
        getSubVector(this,&subvec,&sublemma,&submorph,&subipa,&mapOfSubWords,&local_ad4,&ofsub,
                     &oflemma,&ofmorph,&ofi);
        poVar3 = std::operator<<((ostream *)&ofs,(string *)&word);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = operator<<(poVar3,&vec);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&word);
        id = id + 1;
      }
      std::ofstream::close();
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&mapOfSubWords._M_t);
      Vector::~Vector(&subipa);
      Vector::~Vector(&submorph);
      Vector::~Vector(&sublemma);
      Vector::~Vector(&subvec);
      Vector::~Vector(&vec);
      std::ofstream::~ofstream(&ofi);
      std::ofstream::~ofstream(&ofmorph);
      std::ofstream::~ofstream(&oflemma);
      std::ofstream::~ofstream(&ofsub);
      std::ofstream::~ofstream(&ofs);
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Error opening file for saving subword vectors.")
    ;
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  exit(1);
}

Assistant:

void FastText::saveVectors() {
  std::cout << "Saving Vectors" << std::endl;
  std::ofstream ofs(args_->output + ".vec");
  std::ofstream ofsub(args_->suboutput + ".vec");
  std::ofstream oflemma(args_->lemmaoutput + ".vec");
  std::ofstream ofmorph(args_->morphoutput + ".vec");
  std::ofstream ofi(args_->ipaoutput + ".vec");
  if (!ofs.is_open()) {
    std::cout << "Error opening file for saving vectors." << std::endl;
    exit(EXIT_FAILURE);
  }
  if (!ofsub.is_open()) {
    std::cout << "Error opening file for saving subword vectors." << std::endl;
    exit(EXIT_FAILURE);
  }
  ofs << dict_->nwords() << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  Vector subvec(args_->dim);
  Vector sublemma(args_->dim);
  Vector submorph(args_->dim);
  Vector subipa(args_->dim);
  std::map<int32_t,std::string> mapOfSubWords;
 
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
   //std::cout << i << std::endl; 
   getVector(vec, word);
   getSubVector(subvec,sublemma,submorph,subipa, mapOfSubWords,i,ofsub,oflemma,ofmorph,ofi);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}